

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O0

Iff_Man_t * Gia_ManIffStart(Gia_Man_t *pGia)

{
  int iVar1;
  Iff_Man_t *pIVar2;
  Vec_Flt_t *pVVar3;
  Vec_Int_t *pVVar4;
  Iff_Man_t *p;
  Gia_Man_t *pGia_local;
  
  pIVar2 = (Iff_Man_t *)calloc(1,0x40);
  iVar1 = Gia_ManObjNum(pGia);
  pVVar3 = Vec_FltStartFull(iVar1);
  pIVar2->vTimes = pVVar3;
  iVar1 = Gia_ManObjNum(pGia);
  pVVar4 = Vec_IntStartFull(iVar1);
  pIVar2->vMatch[2] = pVVar4;
  iVar1 = Gia_ManObjNum(pGia);
  pVVar4 = Vec_IntStartFull(iVar1);
  pIVar2->vMatch[3] = pVVar4;
  return pIVar2;
}

Assistant:

Iff_Man_t * Gia_ManIffStart( Gia_Man_t * pGia )
{
    Iff_Man_t * p = ABC_CALLOC( Iff_Man_t, 1 );
    p->vTimes    = Vec_FltStartFull( Gia_ManObjNum(pGia) );
    p->vMatch[2] = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vMatch[3] = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    return p;
}